

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O3

int GetAllSupportedScanModesRPLIDAR(RPLIDAR *pRPLIDAR,RPLIDARSCANMODE *pScanModes)

{
  int iVar1;
  ulong uVar2;
  char *__s;
  uint uVar3;
  uchar databuf [68];
  uint local_80;
  uint local_7c;
  uchar local_78 [4];
  byte bStack_74;
  undefined1 uStack_73;
  undefined2 uStack_72;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  
  local_78[0] = '\0';
  local_78[1] = '\0';
  local_78[2] = '\0';
  local_78[3] = '\0';
  bStack_74 = 0;
  uStack_73 = 0;
  uStack_72 = 0;
  uStack_70 = 0;
  uStack_6c = 0;
  local_68 = 0;
  uStack_64 = 0;
  uStack_60 = 0;
  uStack_5c = 0;
  local_58 = 0;
  uStack_54 = 0;
  uStack_50 = 0;
  uStack_4c = 0;
  local_48 = 0;
  uStack_44 = 0;
  uStack_40 = 0;
  uStack_3c = 0;
  local_38 = 0;
  iVar1 = GetConfRPLIDAR(pRPLIDAR,0x70,(uchar *)0x0,0,local_78,6);
  if (iVar1 == 0) {
    __s = "A RPLIDAR is not responding correctly : Bad response payload type. ";
    if (local_78[0] == 'p') {
      if (CONCAT11(uStack_73,bStack_74) == 0) {
        __s = "A RPLIDAR is not responding correctly. ";
      }
      else {
        uVar3 = (uint)CONCAT11(uStack_73,bStack_74);
        if (0x10 < uVar3) {
          puts("Warning : RPLIDAR unsupported scanmodes. ");
        }
        uVar2 = 0;
        memset(pScanModes,0,0x600);
        local_7c = 0x10;
        if (uVar3 < 0x10) {
          local_7c = uVar3;
        }
        local_80 = 0;
        while( true ) {
          pScanModes[uVar2].id = (int)uVar2;
          local_48 = 0;
          uStack_44 = 0;
          uStack_40 = 0;
          uStack_3c = 0;
          local_58 = 0;
          uStack_54 = 0;
          uStack_50 = 0;
          uStack_4c = 0;
          local_68 = 0;
          uStack_64 = 0;
          uStack_60 = 0;
          uStack_5c = 0;
          local_78[0] = '\0';
          local_78[1] = '\0';
          local_78[2] = '\0';
          local_78[3] = '\0';
          bStack_74 = 0;
          uStack_73 = 0;
          uStack_72 = 0;
          uStack_70 = 0;
          uStack_6c = 0;
          local_38 = 0;
          iVar1 = GetConfRPLIDAR(pRPLIDAR,0x71,(uchar *)&local_80,2,local_78,8);
          if (iVar1 != 0) {
            return 1;
          }
          if (local_78[0] != 'q') break;
          pScanModes[local_80].us_per_sample =
               (double)(CONCAT22(uStack_72,CONCAT11(uStack_73,bStack_74)) >> 8);
          local_48 = 0;
          uStack_44 = 0;
          uStack_40 = 0;
          uStack_3c = 0;
          local_58 = 0;
          uStack_54 = 0;
          uStack_50 = 0;
          uStack_4c = 0;
          local_68 = 0;
          uStack_64 = 0;
          uStack_60 = 0;
          uStack_5c = 0;
          local_78[0] = '\0';
          local_78[1] = '\0';
          local_78[2] = '\0';
          local_78[3] = '\0';
          bStack_74 = 0;
          uStack_73 = 0;
          uStack_72 = 0;
          uStack_70 = 0;
          uStack_6c = 0;
          local_38 = 0;
          iVar1 = GetConfRPLIDAR(pRPLIDAR,0x74,(uchar *)&local_80,2,local_78,8);
          if (iVar1 != 0) {
            return 1;
          }
          if (local_78[0] != 't') break;
          pScanModes[local_80].max_distance =
               (double)(CONCAT22(uStack_72,CONCAT11(uStack_73,bStack_74)) >> 8);
          local_48 = 0;
          uStack_44 = 0;
          uStack_40 = 0;
          uStack_3c = 0;
          local_58 = 0;
          uStack_54 = 0;
          uStack_50 = 0;
          uStack_4c = 0;
          local_68 = 0;
          uStack_64 = 0;
          uStack_60 = 0;
          uStack_5c = 0;
          local_78[0] = '\0';
          local_78[1] = '\0';
          local_78[2] = '\0';
          local_78[3] = '\0';
          bStack_74 = 0;
          uStack_73 = 0;
          uStack_72 = 0;
          uStack_70 = 0;
          uStack_6c = 0;
          local_38 = 0;
          iVar1 = GetConfRPLIDAR(pRPLIDAR,0x75,(uchar *)&local_80,2,local_78,5);
          if (iVar1 != 0) {
            return 1;
          }
          if (local_78[0] != 'u') break;
          pScanModes[local_80].ans_type = (uint)bStack_74;
          local_48 = 0;
          uStack_44 = 0;
          uStack_40 = 0;
          uStack_3c = 0;
          local_58 = 0;
          uStack_54 = 0;
          uStack_50 = 0;
          uStack_4c = 0;
          local_68 = 0;
          uStack_64 = 0;
          uStack_60 = 0;
          uStack_5c = 0;
          local_78[0] = '\0';
          local_78[1] = '\0';
          local_78[2] = '\0';
          local_78[3] = '\0';
          bStack_74 = 0;
          uStack_73 = 0;
          uStack_72 = 0;
          uStack_70 = 0;
          uStack_6c = 0;
          local_38 = 0;
          iVar1 = GetConfRPLIDAR(pRPLIDAR,0x7f,(uchar *)&local_80,2,local_78,0x40);
          if (iVar1 != 0) {
            return 1;
          }
          if (local_78[0] != '\x7f') break;
          uVar2 = (ulong)local_80;
          *(ulong *)(pScanModes[uVar2].scan_mode + 0x30) = CONCAT44(uStack_40,uStack_44);
          *(ulong *)(pScanModes[uVar2].scan_mode + 0x30 + 8) = CONCAT44(local_38,uStack_3c);
          *(ulong *)(pScanModes[uVar2].scan_mode + 0x20) = CONCAT44(uStack_50,uStack_54);
          *(ulong *)(pScanModes[uVar2].scan_mode + 0x20 + 8) = CONCAT44(local_48,uStack_4c);
          *(ulong *)(pScanModes[uVar2].scan_mode + 0x10) = CONCAT44(uStack_60,uStack_64);
          *(ulong *)(pScanModes[uVar2].scan_mode + 0x10 + 8) = CONCAT44(local_58,uStack_5c);
          *(ulong *)pScanModes[uVar2].scan_mode =
               CONCAT44(uStack_70,CONCAT22(uStack_72,CONCAT11(uStack_73,bStack_74)));
          *(ulong *)(pScanModes[uVar2].scan_mode + 8) = CONCAT44(local_68,uStack_6c);
          local_80 = local_80 + 1;
          uVar2 = (ulong)local_80;
          if (local_7c <= local_80) {
            return 0;
          }
        }
        __s = "A RPLIDAR is not responding correctly : Bad response payload type. ";
      }
    }
    puts(__s);
  }
  return 1;
}

Assistant:

inline int GetAllSupportedScanModesRPLIDAR(RPLIDAR* pRPLIDAR, RPLIDARSCANMODE* pScanModes)
{
#ifdef ENABLE_RPLIDAR_SDK_SUPPORT
#ifdef FORCE_RPLIDAR_SDK_V1
	std::vector<RplidarScanMode> outModes;
#else
	std::vector<LidarScanMode> outModes;
#endif // FORCE_RPLIDAR_SDK_V1
	unsigned int i = 0;

	if (SL_IS_FAIL(pRPLIDAR->drv->getAllSupportedScanModes(outModes)))
	{
		printf("A RPLIDAR is not responding correctly : getAllSupportedScanModes() failed. \n");
		return EXIT_FAILURE;
	}
	if (outModes.size() > MAX_NB_SCAN_MODES_RPLIDAR) printf("Warning : RPLIDAR unsupported scanmodes. \n");
	memset(pScanModes, 0, sizeof(RPLIDARSCANMODE)*MAX_NB_SCAN_MODES_RPLIDAR);
	for (i = 0; i < min(outModes.size(), (unsigned int)MAX_NB_SCAN_MODES_RPLIDAR); i++)
	{
		pScanModes[i].id = (int)outModes[i].id;
		pScanModes[i].us_per_sample = (double)outModes[i].us_per_sample;
		pScanModes[i].max_distance = (double)outModes[i].max_distance;
		pScanModes[i].ans_type = (int)outModes[i].ans_type;
		memcpy(pScanModes[i].scan_mode, outModes[i].scan_mode, sizeof(pScanModes[i].scan_mode));
	}
	return EXIT_SUCCESS;
#else
	unsigned char databuf[68];
	unsigned short scanmodecount = 0;
	unsigned int i = 0, uspersample = 0, maxdistance = 0;

	memset(databuf, 0, sizeof(databuf));
	if (GetConfRPLIDAR(pRPLIDAR, LIDAR_CONF_SCAN_MODE_COUNT_RPLIDAR, NULL, 0, databuf, 6) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if (databuf[0] != (unsigned char)LIDAR_CONF_SCAN_MODE_COUNT_RPLIDAR)
	{
		printf("A RPLIDAR is not responding correctly : Bad response payload type. \n");
		return EXIT_FAILURE;
	}
	scanmodecount = (unsigned short)((databuf[5]<<8)|databuf[4]);
	if (scanmodecount <= 0)
	{
		printf("A RPLIDAR is not responding correctly. \n");
		return EXIT_FAILURE;
	}
	if (scanmodecount > MAX_NB_SCAN_MODES_RPLIDAR) printf("Warning : RPLIDAR unsupported scanmodes. \n");

	memset(pScanModes, 0, sizeof(RPLIDARSCANMODE)*MAX_NB_SCAN_MODES_RPLIDAR);
	for (i = 0; i < min(scanmodecount, (unsigned int)MAX_NB_SCAN_MODES_RPLIDAR); i++)
	{
		pScanModes[i].id = (int)i;
		memset(databuf, 0, sizeof(databuf));
		if (GetConfRPLIDAR(pRPLIDAR, LIDAR_CONF_SCAN_MODE_US_PER_SAMPLE_RPLIDAR, (unsigned char*)&i, 2, databuf, 8) != EXIT_SUCCESS)
		{
			return EXIT_FAILURE;
		}
		if (databuf[0] != (unsigned char)LIDAR_CONF_SCAN_MODE_US_PER_SAMPLE_RPLIDAR)
		{
			printf("A RPLIDAR is not responding correctly : Bad response payload type. \n");
			return EXIT_FAILURE;
		}
		memcpy((unsigned char*)&uspersample, databuf+4, 4);
		pScanModes[i].us_per_sample = (double)(uspersample/(1<<8));

		memset(databuf, 0, sizeof(databuf));
		if (GetConfRPLIDAR(pRPLIDAR, LIDAR_CONF_SCAN_MODE_MAX_DISTANCE_RPLIDAR, (unsigned char*)&i, 2, databuf, 8) != EXIT_SUCCESS)
		{
			return EXIT_FAILURE;
		}
		if (databuf[0] != (unsigned char)LIDAR_CONF_SCAN_MODE_MAX_DISTANCE_RPLIDAR)
		{
			printf("A RPLIDAR is not responding correctly : Bad response payload type. \n");
			return EXIT_FAILURE;
		}
		memcpy((unsigned char*)&maxdistance, databuf+4, 4);
		pScanModes[i].max_distance = (double)(maxdistance/(1<<8));

		memset(databuf, 0, sizeof(databuf));
		if (GetConfRPLIDAR(pRPLIDAR, LIDAR_CONF_SCAN_MODE_ANS_TYPE_RPLIDAR, (unsigned char*)&i, 2, databuf, 5) != EXIT_SUCCESS)
		{
			return EXIT_FAILURE;
		}
		if (databuf[0] != (unsigned char)LIDAR_CONF_SCAN_MODE_ANS_TYPE_RPLIDAR)
		{
			printf("A RPLIDAR is not responding correctly : Bad response payload type. \n");
			return EXIT_FAILURE;
		}
		pScanModes[i].ans_type = (int)databuf[4];

		memset(databuf, 0, sizeof(databuf));
		if (GetConfRPLIDAR(pRPLIDAR, LIDAR_CONF_SCAN_MODE_NAME_RPLIDAR, (unsigned char*)&i, 2, databuf, 64) != EXIT_SUCCESS)
		{
			return EXIT_FAILURE;
		}
		if (databuf[0] != (unsigned char)LIDAR_CONF_SCAN_MODE_NAME_RPLIDAR)
		{
			printf("A RPLIDAR is not responding correctly : Bad response payload type. \n");
			return EXIT_FAILURE;
		}
		memset(pScanModes[i].scan_mode, 0, sizeof(pScanModes[i].scan_mode));
		memcpy(pScanModes[i].scan_mode, databuf+4, sizeof(pScanModes[i].scan_mode));
	}
	return EXIT_SUCCESS;
#endif // ENABLE_RPLIDAR_SDK_SUPPORT
}